

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdMinBase(word *pTruth,int nVars,int *pVarsNew)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  word *pwVar8;
  word *pwVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (0 < nVars) {
    uVar3 = 0;
    do {
      pVarsNew[uVar3] = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while ((uint)nVars != uVar3);
  }
  uVar3 = (ulong)(uint)nVars;
  if (0 < nVars) {
    do {
      if ((long)nVars < (long)uVar3) {
        __assert_fail("iVar < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x402,"int Abc_TtHasVar(word *, int, int)");
      }
      uVar11 = uVar3 - 1;
      if (nVars < 7) {
        if ((s_Truths6Neg[uVar11] &
            (*pTruth >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x3f) ^ *pTruth)) == 0)
        goto LAB_0049d083;
      }
      else {
        iVar1 = nVars + -6;
        if (uVar3 < 7) {
          if (iVar1 != 0x1f) {
            uVar5 = 1 << ((byte)iVar1 & 0x1f);
            if ((int)uVar5 < 2) {
              uVar5 = 1;
            }
            uVar7 = 0;
            do {
              if (((pTruth[uVar7] >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x3f) ^ pTruth[uVar7]) &
                  s_Truths6Neg[uVar11]) != 0) goto LAB_0049d09e;
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
        }
        else if (iVar1 != 0x1f) {
          bVar4 = (byte)(uVar3 - 7);
          uVar5 = 1 << (bVar4 & 0x1f);
          iVar6 = 2 << (bVar4 & 0x1f);
          uVar7 = 1;
          if (1 < (int)uVar5) {
            uVar7 = (ulong)uVar5;
          }
          pwVar8 = pTruth + (int)uVar5;
          pwVar9 = pTruth;
          do {
            if (uVar3 - 7 != 0x1f) {
              uVar10 = 0;
              do {
                if (pwVar9[uVar10] != pwVar8[uVar10]) goto LAB_0049d09e;
                uVar10 = uVar10 + 1;
              } while (uVar7 != uVar10);
            }
            pwVar9 = pwVar9 + iVar6;
            pwVar8 = pwVar8 + iVar6;
          } while (pwVar9 < pTruth + (1 << ((byte)iVar1 & 0x1f)));
        }
LAB_0049d083:
        Abc_TtSwapVars(pTruth,nVars,(int)uVar11,nVars + -1);
        pVarsNew[uVar11] = pVarsNew[(long)nVars + -1];
        nVars = nVars + -1;
      }
LAB_0049d09e:
      bVar2 = 1 < (long)uVar3;
      uVar3 = uVar11;
    } while (bVar2);
  }
  return nVars;
}

Assistant:

int Dau_DsdMinBase( word * pTruth, int nVars, int * pVarsNew )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        pVarsNew[v] = v;
    for ( v = nVars - 1; v >= 0; v-- )
    {
        if ( Abc_TtHasVar( pTruth, nVars, v ) )
            continue;
        Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
        pVarsNew[v] = pVarsNew[--nVars];
    }
    return nVars;
}